

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateSubDataTest::CheckErrorAndLog
          (InvalidateSubDataTest *this,GLenum *attachments,GLuint count)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  string attachments_names;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  InvalidateSubDataTest *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_1e8 = local_1d8;
    local_1c8 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,0x1b32ab9);
    if (count != 0) {
      uVar2 = 0;
      do {
        local_1c0.m_value = attachments[uVar2];
        local_1c0.m_getName = glu::getFramebufferAttachmentName;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_1b0,&local_1c0);
        std::__cxx11::string::_M_append((char *)&local_1e8,local_1b0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != local_1a0) {
          operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
        }
        if (count - 1 != uVar2) {
          std::__cxx11::string::append((char *)&local_1e8);
        }
        uVar2 = uVar2 + 1;
      } while (count != uVar2);
    }
    local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"InvalidateSubDataTest unexpectedly generated ",0x2d);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," error for following attachments [",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)local_1e8,local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]. Test fails.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
  }
  return iVar1 == 0;
}

Assistant:

bool InvalidateSubDataTest::CheckErrorAndLog(const glw::GLenum attachments[], glw::GLuint count)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check error. */
	if (glw::GLenum error = gl.getError())
	{
		/* There is an error. Log. */
		std::string attachments_names = "";

		for (glw::GLuint i = 0; i < count; ++i)
		{
			attachments_names.append(glu::getFramebufferAttachmentStr(attachments[i]).toString());

			if ((count - 1) != i)
			{
				attachments_names.append(", ");
			}
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "InvalidateSubDataTest unexpectedly generated "
											<< glu::getErrorStr(error) << " error for following attachments ["
											<< attachments_names << "]. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}